

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

int __thiscall Fl_Help_View::find(Fl_Help_View *this,char *s,int p)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  uint __c;
  Fl_Help_Block *pFVar10;
  char *pcVar11;
  ulong local_58;
  char *local_38;
  
  if ((s != (char *)0x0) && (this->value_ != (char *)0x0)) {
    if (p < 0) {
      local_58 = 0;
    }
    else {
      sVar7 = strlen(this->value_);
      local_58 = 0;
      if ((p != 0) && (p < (int)sVar7)) {
        local_58 = (ulong)(p + 1);
      }
    }
    pFVar10 = this->blocks_;
    for (iVar3 = this->nblocks_; 0 < iVar3; iVar3 = iVar3 + -1) {
      pcVar8 = this->value_ + local_58;
      if (pcVar8 <= pFVar10->end) {
        pcVar9 = pFVar10->start;
        pcVar11 = s;
        local_38 = pcVar9;
        if (pcVar9 < pcVar8) {
          pcVar9 = pcVar8;
          local_38 = pcVar8;
        }
        while( true ) {
          if (*pcVar11 == '\0') {
            topline(this,pFVar10->y - pFVar10->h);
            return *(int *)&pFVar10->end - *(int *)&this->value_;
          }
          cVar2 = *pcVar9;
          __c = (uint)cVar2;
          if ((__c == 0) || (pFVar10->end <= pcVar9)) break;
          if (cVar2 == '&') {
            uVar4 = quote_char(pcVar9 + 1);
            __c = 0x26;
            if (-1 < (int)uVar4) {
              pcVar9 = strchr(pcVar9 + 1,0x3b);
              pcVar9 = pcVar9 + 1;
              __c = uVar4;
            }
LAB_001b10fe:
            iVar5 = tolower((int)*pcVar11);
            iVar6 = tolower(__c);
            if (iVar5 == iVar6) {
              pcVar11 = pcVar11 + 1;
            }
            else {
              pcVar9 = local_38 + 1;
              pcVar11 = s;
              local_38 = pcVar9;
            }
          }
          else {
            if (cVar2 != '<') goto LAB_001b10fe;
            while ((((char)__c != '\0' && (pcVar9 < pFVar10->end)) && ((char)__c != '>'))) {
              pbVar1 = (byte *)(pcVar9 + 1);
              pcVar9 = pcVar9 + 1;
              __c = (uint)*pbVar1;
            }
          }
          pcVar9 = pcVar9 + 1;
        }
      }
      pFVar10 = pFVar10 + 1;
    }
  }
  return -1;
}

Assistant:

int						// O - Matching position or -1 if not found
Fl_Help_View::find(const char *s,		// I - String to find
                   int        p)		// I - Starting position
{
  int		i,				// Looping var
		c;				// Current character
  Fl_Help_Block	*b;				// Current block
  const char	*bp,				// Block matching pointer
		*bs,				// Start of current comparison
		*sp;				// Search string pointer


  DEBUG_FUNCTION(__LINE__,__FUNCTION__);

  // Range check input and value...
  if (!s || !value_) return -1;

  if (p < 0 || p >= (int)strlen(value_)) p = 0;
  else if (p > 0) p ++;

  // Look for the string...
  for (i = nblocks_, b = blocks_; i > 0; i --, b ++) {
    if (b->end < (value_ + p))
      continue;

    if (b->start < (value_ + p)) bp = value_ + p;
    else bp = b->start;

    for (sp = s, bs = bp; *sp && *bp && bp < b->end; bp ++) {
      if (*bp == '<') {
        // skip to end of element...
	while (*bp && bp < b->end && *bp != '>') bp ++;
	continue;
      } else if (*bp == '&') {
        // decode HTML entity...
	if ((c = quote_char(bp + 1)) < 0) c = '&';	// *FIXME* UTF-8, see below
	else bp = strchr(bp + 1, ';') + 1;
      } else c = *bp;

      // *FIXME* *UTF-8* (A.S. 02/14/2016)
      // At this point c may be an arbitrary Unicode Code Point corresponding
      // to a quoted character (see above), i.e. it _can_ be a multi byte
      // UTF-8 sequence and must be compared with the corresponding
      // multi byte string in (*sp)...
      // For instance: "&euro;" == 0x20ac -> 0xe2 0x82 0xac (UTF-8: 3 bytes).
      // Hint: use fl_utf8encode() [see below]

      if (tolower(*sp) == tolower(c)) sp ++;
      else {
        // No match, so reset to start of search...
	sp = s;
	bs ++;
	bp = bs;
      }
    }

    if (!*sp) {
      // Found a match!
      topline(b->y - b->h);
      return (int) (b->end - value_);
    }
  }

  // No match!
  return (-1);
}